

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

bool StringFormatter<char_const*,std::__cxx11::string>::output_using_operator<char_const*>
               (ostream *os,char **value)

{
  char *__s;
  size_t sVar1;
  
  __s = *value;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  return true;
}

Assistant:

static bool output_using_operator(std::ostream& os, const T& value)
    {
        if constexpr (is_stream_insertable_v<T>) {
            os << value;
            return true;
        }
        return false;
    }